

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeBatchResult.cpp
# Opt level: O1

bool __thiscall xe::BatchResult::hasTestCaseResult(BatchResult *this,char *casePath)

{
  const_iterator cVar1;
  allocator<char> local_39;
  key_type local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,casePath,&local_39);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_resultMap)._M_t,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return (_Rb_tree_header *)cVar1._M_node != &(this->m_resultMap)._M_t._M_impl.super__Rb_tree_header
  ;
}

Assistant:

bool BatchResult::hasTestCaseResult (const char* casePath) const
{
	return m_resultMap.find(casePath) != m_resultMap.end();
}